

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall
QHeaderViewPrivate::resizeSections
          (QHeaderViewPrivate *this,ResizeMode globalMode,bool useGlobalMode)

{
  QObject *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ResizeMode RVar7;
  iterator iVar8;
  ResizeMode RVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ResizeMode RVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int local_c4;
  uint local_bc;
  ulong local_a8;
  QArrayDataPointer<int> local_88;
  uint local_64;
  uint local_60;
  int local_5c;
  void *local_58;
  int *local_50;
  uint *local_48;
  uint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this->headerMode != InitialNoSectionMemoryUsage) ||
     (((((this->stretchSections != 0 || (this->stretchLastSection != false)) ||
        (this->contentsSections != 0)) || ((useGlobalMode && (this->globalResizeMode != Custom))))
      && (setHeaderMode(this,FlexibleWithSectionMemoryUsage),
         this->headerMode != InitialNoSectionMemoryUsage)))) {
    iVar10 = (int)(this->sectionItems).d.size;
  }
  else {
    iVar10 = (int)this->countInNoSectionItemsMode;
  }
  if ((iVar10 != 0) && (this->resizeRecursionBlock == false)) {
    this->resizeRecursionBlock = true;
    (this->cachedSizeHint).wd = -1;
    (this->cachedSizeHint).ht = -1;
    uVar3 = QHeaderView::visualIndex((QHeaderView *)this_00,this->lastSectionLogicalIdx);
    uVar13 = (ulong)uVar3;
    if (useGlobalMode) {
      uVar13 = 0xffffffff;
    }
    bVar17 = this->orientation != Horizontal;
    pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    uVar12 = ((&(pQVar1->crect).x2)[bVar17].m_i - (&(pQVar1->crect).x1)[bVar17].m_i) + 1;
    local_88.d = (Data *)0x0;
    local_88.ptr = (int *)0x0;
    local_88.size = 0;
    if (this->stretchLastSection == false) {
      uVar13 = 0xffffffff;
    }
    uVar15 = 0;
    uVar14 = 0;
    do {
      if (this->headerMode == InitialNoSectionMemoryUsage) {
        if ((long)(int)this->countInNoSectionItemsMode <= (long)uVar15) goto LAB_00549d08;
LAB_00549b0a:
        RVar9 = globalMode;
        if (useGlobalMode) {
LAB_00549b15:
          if (RVar9 != Stretch) {
            if ((RVar9 & ~Custom) == Interactive) {
              uVar4 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
              if (this->headerMode == InitialNoSectionMemoryUsage) {
                uVar6 = this->defaultSectionSize;
              }
              else {
                uVar6 = 0xffffffff;
                if ((long)uVar15 < (long)(int)(this->sectionItems).d.size) {
                  uVar6 = *(uint *)((this->sectionItems).d.ptr + uVar15) & 0xfffff;
                }
              }
              uVar5 = *(uint *)(*(long *)(this_00 + 8) + 0x608);
              if (uVar5 == 0xffffffff) {
                uVar5 = 0xfffff;
              }
              if ((int)uVar6 <= (int)uVar5) {
                uVar5 = uVar6;
              }
              if ((int)uVar5 <= (int)uVar4) {
                uVar5 = uVar4;
              }
            }
            else {
              lVar2 = *(long *)(this_00 + 8);
              if (*(int *)(lVar2 + 0x650) == 0) {
                iVar10 = (int)uVar15;
                if ((long)*(int *)(lVar2 + 0x658) <= (long)uVar15) {
                  iVar10 = -1;
                }
              }
              else {
                iVar10 = -1;
                if (((long)uVar15 < (long)*(int *)(lVar2 + 0x648)) &&
                   (iVar10 = (int)uVar15, *(long *)(lVar2 + 0x580) != 0)) {
                  iVar10 = *(int *)(*(long *)(lVar2 + 0x578) + uVar15 * 4);
                }
              }
              uVar4 = viewSectionSizeHint(this,iVar10);
              uVar5 = QHeaderView::sectionSizeHint((QHeaderView *)this_00,iVar10);
              if ((int)uVar5 < (int)uVar4) {
                uVar5 = uVar4;
              }
            }
            uVar6 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
            uVar4 = *(uint *)(*(long *)(this_00 + 8) + 0x608);
            if (uVar4 == 0xffffffff) {
              uVar4 = 0xfffff;
            }
            if ((int)uVar5 <= (int)uVar4) {
              uVar4 = uVar5;
            }
            if ((int)uVar6 <= (int)uVar4) {
              uVar6 = uVar4;
            }
            local_58 = (void *)CONCAT44(local_58._4_4_,uVar6);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)&local_88,local_88.size,(int *)&local_58);
            QList<int>::end((QList<int> *)&local_88);
            uVar12 = uVar12 - uVar6;
            goto LAB_00549d00;
          }
        }
        else if (uVar13 != uVar15) {
          if (uVar15 < (ulong)(this->sectionItems).d.size) {
            RVar9 = *(uint *)((this->sectionItems).d.ptr + uVar15) >> 0x15 & 0x1f;
          }
          else {
            RVar9 = this->globalResizeMode;
          }
          goto LAB_00549b15;
        }
        if (this->headerMode == InitialNoSectionMemoryUsage) {
          uVar4 = this->defaultSectionSize;
        }
        else {
          uVar4 = 0xffffffff;
          if ((long)uVar15 < (long)(int)(this->sectionItems).d.size) {
            uVar4 = *(uint *)((this->sectionItems).d.ptr + uVar15) & 0xfffff;
          }
        }
        uVar14 = uVar14 + 1;
        local_58 = (void *)CONCAT44(local_58._4_4_,uVar4);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_88,local_88.size,(int *)&local_58);
        QList<int>::end((QList<int> *)&local_88);
      }
      else {
        if ((long)(int)(this->sectionItems).d.size <= (long)uVar15) goto LAB_00549d08;
        if (((this->sectionItems).d.ptr[uVar15].field_0x2 & 0x10) == 0) goto LAB_00549b0a;
      }
LAB_00549d00:
      uVar15 = uVar15 + 1;
    } while( true );
  }
LAB_00549fd2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00549d08:
  local_bc = 0xffffffff;
  if ((int)uVar14 < 1) {
    local_a8 = 0;
  }
  else {
    local_a8 = 0;
    if (0 < (int)uVar12) {
      local_bc = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
      local_a8 = (ulong)uVar12 % (ulong)uVar14;
      if ((int)local_bc < (int)(uVar12 / uVar14)) {
        local_bc = uVar12 / uVar14;
      }
    }
  }
  uVar15 = 0;
  local_c4 = 0;
  uVar12 = 0;
  RVar9 = Interactive;
  do {
    if (this->headerMode == InitialNoSectionMemoryUsage) {
      uVar11 = this->countInNoSectionItemsMode;
      if ((long)(int)uVar11 <= (long)uVar15) break;
      uVar14 = this->defaultSectionSize;
      uVar11 = (this->sectionItems).d.size;
    }
    else {
      uVar11 = (this->sectionItems).d.size;
      if ((long)(int)uVar11 <= (long)uVar15) break;
      uVar14 = *(uint *)((this->sectionItems).d.ptr + uVar15) & 0xfffff;
    }
    if (uVar15 < uVar11) {
      RVar16 = *(uint *)((this->sectionItems).d.ptr + uVar15) >> 0x15 & 0x1f;
    }
    else {
      RVar16 = this->globalResizeMode;
    }
    if ((this->headerMode == InitialNoSectionMemoryUsage) ||
       (uVar4 = 0, ((this->sectionItems).d.ptr[uVar15].field_0x2 & 0x10) == 0)) {
      RVar7 = RVar16;
      if (uVar13 == uVar15) {
        RVar7 = Stretch;
      }
      if (useGlobalMode) {
        RVar7 = globalMode;
      }
      if ((RVar7 == Stretch) && (local_bc != 0xffffffff)) {
        uVar4 = this->lastSectionSize;
        if (this->lastSectionSize < (int)local_bc) {
          uVar4 = local_bc;
        }
        if (uVar3 != uVar15) {
          uVar4 = local_bc;
        }
        iVar10 = (int)local_a8;
        uVar6 = iVar10 - 1;
        if (iVar10 < 1) {
          uVar6 = 0;
        }
        local_a8 = (ulong)uVar6;
        uVar4 = (0 < iVar10) + uVar4;
        if ((&(local_88.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<int>::reallocateAndGrow
                    (&local_88,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
        }
      }
      else {
        iVar8 = QList<int>::begin((QList<int> *)&local_88);
        uVar4 = *iVar8.i;
      }
      local_88.ptr = local_88.ptr + 1;
      local_88.size = local_88.size + -1;
    }
    iVar10 = (int)uVar15;
    if (RVar9 == RVar16) {
      if (uVar12 != uVar4 && uVar15 != 0) {
LAB_00549eea:
        createSectionItems(this,local_c4,iVar10 + -1,uVar12,RVar9);
        local_c4 = iVar10;
      }
    }
    else if (uVar15 != 0) goto LAB_00549eea;
    if (uVar4 != uVar14) {
      if ((this->logicalIndices).d.size != 0) {
        iVar10 = (this->logicalIndices).d.ptr[uVar15];
      }
      local_58 = (void *)0x0;
      local_50 = &local_5c;
      local_48 = &local_60;
      local_40 = &local_64;
      local_64 = uVar4;
      local_60 = uVar14;
      local_5c = iVar10;
      QMetaObject::activate(this_00,&QHeaderView::staticMetaObject,1,&local_58);
    }
    uVar15 = uVar15 + 1;
    uVar12 = uVar4;
    RVar9 = RVar16;
  } while( true );
  createSectionItems(this,local_c4,(int)uVar11 + -1,uVar12,RVar9);
  this->resizeRecursionBlock = false;
  QWidget::update((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport);
  if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d)->super_QArrayData,4,0x10);
    }
  }
  goto LAB_00549fd2;
}

Assistant:

void QHeaderViewPrivate::resizeSections(QHeaderView::ResizeMode globalMode, bool useGlobalMode)
{
    Q_Q(QHeaderView);
    //stop the timer in case it is delayed
    delayedResize.stop();

    executePostedLayout();

    if (noSectionMemoryUsage() &&
       (hasAutoResizeSections() || (useGlobalMode && globalResizeMode != QHeaderView::Fixed))) {
        setHeaderMode(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    if (sectionCount() == 0 )
        return;

    if (resizeRecursionBlock)
        return;
    resizeRecursionBlock = true;

    invalidateCachedSizeHint();
    const int lastSectionVisualIdx = q->visualIndex(lastSectionLogicalIdx);

    // find stretchLastSection if we have it
    int stretchSection = -1;
    if (stretchLastSection && !useGlobalMode)
        stretchSection = lastSectionVisualIdx;

    // count up the number of stretched sections and how much space left for them
    int lengthToStretch = (orientation == Qt::Horizontal ? viewport->width() : viewport->height());
    int numberOfStretchedSections = 0;
    QList<int> section_sizes;
    for (int i = 0; i < sectionCount(); ++i) {
        if (isVisualIndexHidden(i))
            continue;

        QHeaderView::ResizeMode resizeMode;
        if (useGlobalMode && (i != stretchSection))
            resizeMode = globalMode;
        else
            resizeMode = (i == stretchSection ? QHeaderView::Stretch : headerSectionResizeMode(i));

        if (resizeMode == QHeaderView::Stretch) {
            ++numberOfStretchedSections;
            section_sizes.append(headerSectionSize(i));
            continue;
        }

        // because it isn't stretch, determine its width and remove that from lengthToStretch
        int sectionSize = 0;
        if (resizeMode == QHeaderView::Interactive || resizeMode == QHeaderView::Fixed) {
            sectionSize = qBound(q->minimumSectionSize(), headerSectionSize(i), q->maximumSectionSize());
        } else { // resizeMode == QHeaderView::ResizeToContents
            int logicalIndex = q->logicalIndex(i);
            sectionSize = qMax(viewSectionSizeHint(logicalIndex),
                               q->sectionSizeHint(logicalIndex));
        }
        sectionSize = qBound(q->minimumSectionSize(),
                             sectionSize,
                             q->maximumSectionSize());

        section_sizes.append(sectionSize);
        lengthToStretch -= sectionSize;
    }

    // calculate the new length for all of the stretched sections
    int stretchSectionLength = -1;
    int pixelReminder = 0;
    if (numberOfStretchedSections > 0 && lengthToStretch > 0) { // we have room to stretch in
        int hintLengthForEveryStretchedSection = lengthToStretch / numberOfStretchedSections;
        stretchSectionLength = qMax(hintLengthForEveryStretchedSection, q->minimumSectionSize());
        pixelReminder = lengthToStretch % numberOfStretchedSections;
    }

    // ### The code below would be nicer if it was cleaned up a bit (since spans has been replaced with items)
    int spanStartSection = 0;
    int previousSectionLength = 0;

    QHeaderView::ResizeMode previousSectionResizeMode = QHeaderView::Interactive;

    // resize each section along the total length
    for (int i = 0; i < sectionCount(); ++i) {
        int oldSectionLength = headerSectionSize(i);
        int newSectionLength = -1;
        QHeaderView::ResizeMode newSectionResizeMode = headerSectionResizeMode(i);

        if (isVisualIndexHidden(i)) {
            newSectionLength = 0;
        } else {
            QHeaderView::ResizeMode resizeMode;
            if (useGlobalMode)
                resizeMode = globalMode;
            else
                resizeMode = (i == stretchSection
                              ? QHeaderView::Stretch
                              : newSectionResizeMode);
            if (resizeMode == QHeaderView::Stretch && stretchSectionLength != -1) {
                if (i == lastSectionVisualIdx)
                    newSectionLength = qMax(stretchSectionLength, lastSectionSize);
                else
                    newSectionLength = stretchSectionLength;
                if (pixelReminder > 0) {
                    newSectionLength += 1;
                    --pixelReminder;
                }
                section_sizes.removeFirst();
            } else {
                newSectionLength = section_sizes.takeFirst();
            }
        }

        //Q_ASSERT(newSectionLength > 0);
        if ((previousSectionResizeMode != newSectionResizeMode
            || previousSectionLength != newSectionLength) && i > 0) {
            createSectionItems(spanStartSection, i - 1, previousSectionLength, previousSectionResizeMode);
            //Q_ASSERT(headerLength() == length);
            spanStartSection = i;
        }

        if (newSectionLength != oldSectionLength)
            emit q->sectionResized(logicalIndex(i), oldSectionLength, newSectionLength);

        previousSectionLength = newSectionLength;
        previousSectionResizeMode = newSectionResizeMode;
    }

    createSectionItems(spanStartSection, sectionCount() - 1,
                       previousSectionLength, previousSectionResizeMode);
    //Q_ASSERT(headerLength() == length);
    resizeRecursionBlock = false;
    viewport->update();
}